

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

void xml_end(void *userData,char *name)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  
  switch(*(undefined4 *)((long)userData + 0x28)) {
  case 1:
    iVar2 = strcmp(name,"xar");
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 0;
    return;
  case 2:
    iVar2 = strcmp(name,"toc");
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 1;
    return;
  case 3:
    pcVar3 = "creation-time";
    goto LAB_001379ef;
  case 4:
    pcVar3 = "checksum";
LAB_001379ef:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
LAB_00137a02:
    *(undefined4 *)((long)userData + 0x28) = 2;
    return;
  case 5:
    pcVar3 = "offset";
    goto LAB_00137a8c;
  case 6:
    pcVar3 = "size";
LAB_00137a8c:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 4;
    return;
  case 7:
    iVar2 = strcmp(name,"file");
    if (iVar2 != 0) {
      return;
    }
    lVar1 = *(long *)(*(long *)((long)userData + 0x1a0) + 0x10);
    if (lVar1 != 0) {
      if ((*(uint *)(*(long *)((long)userData + 0x1a0) + 0x120) & 0xf000) == 0x4000) {
        *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) + 1;
      }
      *(long *)((long)userData + 0x1a0) = lVar1;
      return;
    }
    *(undefined8 *)((long)userData + 0x1a0) = 0;
    goto LAB_00137a02;
  case 8:
    pcVar3 = "data";
    goto LAB_00137c46;
  case 9:
    pcVar3 = "length";
    goto LAB_00137b44;
  case 10:
    pcVar3 = "offset";
    goto LAB_00137b44;
  case 0xb:
    pcVar3 = "size";
    goto LAB_00137b44;
  case 0xc:
    pcVar3 = "encoding";
    goto LAB_00137b44;
  case 0xd:
    pcVar3 = "archived-checksum";
    goto LAB_00137b44;
  case 0xe:
    pcVar3 = "extracted-checksum";
    goto LAB_00137b44;
  case 0xf:
    pcVar3 = "content";
LAB_00137b44:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 8;
    return;
  case 0x10:
    if (*name != 'e') {
      return;
    }
    if (name[1] != 'a') {
      return;
    }
    if (name[2] != '\0') {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 7;
    *(undefined8 *)((long)userData + 0x1a8) = 0;
    return;
  case 0x11:
    pcVar3 = "length";
    goto LAB_00137bea;
  case 0x12:
    pcVar3 = "offset";
    goto LAB_00137bea;
  case 0x13:
    pcVar3 = "size";
    goto LAB_00137bea;
  case 0x14:
    pcVar3 = "encoding";
    goto LAB_00137bea;
  case 0x15:
    pcVar3 = "archived-checksum";
    goto LAB_00137bea;
  case 0x16:
    pcVar3 = "extracted-checksum";
    goto LAB_00137bea;
  case 0x17:
    pcVar3 = "name";
    goto LAB_00137bea;
  case 0x18:
    pcVar3 = "fstype";
LAB_00137bea:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 0x10;
    return;
  case 0x19:
    pcVar3 = "ctime";
    goto LAB_00137c46;
  case 0x1a:
    pcVar3 = "mtime";
    goto LAB_00137c46;
  case 0x1b:
    pcVar3 = "atime";
    goto LAB_00137c46;
  case 0x1c:
    pcVar3 = "group";
    goto LAB_00137c46;
  case 0x1d:
    pcVar3 = "gid";
    goto LAB_00137c46;
  case 0x1e:
    pcVar3 = "user";
    goto LAB_00137c46;
  case 0x1f:
    pcVar3 = "uid";
    goto LAB_00137c46;
  case 0x20:
    pcVar3 = "mode";
    goto LAB_00137c46;
  case 0x21:
    pcVar3 = "device";
    goto LAB_00137c46;
  case 0x22:
    pcVar3 = "GNU.sparse.major";
    goto LAB_001378f0;
  case 0x23:
    pcVar3 = "GNU.sparse.minor";
LAB_001378f0:
    iVar2 = strcmp(name,pcVar3 + 0xb);
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 0x21;
    return;
  case 0x24:
    pcVar3 = "deviceno";
    goto LAB_00137c46;
  case 0x25:
    pcVar3 = "inode";
    goto LAB_00137c46;
  case 0x26:
    pcVar3 = "link";
    goto LAB_00137c46;
  case 0x27:
    pcVar3 = "type";
    goto LAB_00137c46;
  case 0x28:
    pcVar3 = "name";
    goto LAB_00137c46;
  case 0x29:
    pcVar3 = "acl";
    goto LAB_00137c46;
  case 0x2a:
    pcVar3 = "default";
    goto LAB_00137bb8;
  case 0x2b:
    pcVar3 = "access";
    goto LAB_00137bb8;
  case 0x2c:
    pcVar3 = "appleextended";
LAB_00137bb8:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 0x29;
    return;
  case 0x2d:
    pcVar3 = "flags";
    goto LAB_00137c46;
  case 0x2e:
    pcVar3 = "UserNoDump";
    goto LAB_00137c89;
  case 0x2f:
    pcVar3 = "UserImmutable";
    goto LAB_00137c89;
  case 0x30:
    pcVar3 = "UserAppend";
    goto LAB_00137c89;
  case 0x31:
    pcVar3 = "UserOpaque";
    goto LAB_00137c89;
  case 0x32:
    pcVar3 = "UserNoUnlink";
    goto LAB_00137c89;
  case 0x33:
    pcVar3 = "SystemArchived";
    goto LAB_00137c89;
  case 0x34:
    pcVar3 = "SystemImmutable";
    goto LAB_00137c89;
  case 0x35:
    pcVar3 = "SystemAppend";
    goto LAB_00137c89;
  case 0x36:
    pcVar3 = "SystemNoUnlink";
    goto LAB_00137c89;
  case 0x37:
    pcVar3 = "SystemSnapshot";
LAB_00137c89:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 0x2d;
    return;
  case 0x38:
    pcVar3 = "ext2";
LAB_00137c46:
    iVar2 = strcmp(name,pcVar3);
    if (iVar2 != 0) {
      return;
    }
    *(undefined4 *)((long)userData + 0x28) = 7;
    return;
  case 0x39:
    pcVar3 = "SecureDeletion";
    break;
  case 0x3a:
    pcVar3 = "Undelete";
    break;
  case 0x3b:
    pcVar3 = "Compress";
    break;
  case 0x3c:
    pcVar3 = "Synchronous";
    break;
  case 0x3d:
    pcVar3 = "Immutable";
    break;
  case 0x3e:
    pcVar3 = "AppendOnly";
    break;
  case 0x3f:
    pcVar3 = "NoDump";
    break;
  case 0x40:
    pcVar3 = "NoAtime";
    break;
  case 0x41:
    pcVar3 = "CompDirty";
    break;
  case 0x42:
    pcVar3 = "CompBlock";
    break;
  case 0x43:
    pcVar3 = "NoCompBlock";
    break;
  case 0x44:
    pcVar3 = "CompError";
    break;
  case 0x45:
    pcVar3 = "BTree";
    break;
  case 0x46:
    pcVar3 = "HashIndexed";
    break;
  case 0x47:
    pcVar3 = "iMagic";
    break;
  case 0x48:
    pcVar3 = "Journaled";
    break;
  case 0x49:
    pcVar3 = "NoTail";
    break;
  case 0x4a:
    pcVar3 = "DirSync";
    break;
  case 0x4b:
    pcVar3 = "TopDir";
    break;
  case 0x4c:
    pcVar3 = "Reserved";
    break;
  case 0x4d:
    unknowntag_end((xar *)userData,name);
    return;
  default:
    goto switchD_001377e0_default;
  }
  iVar2 = strcmp(name,pcVar3);
  if (iVar2 == 0) {
    *(undefined4 *)((long)userData + 0x28) = 0x38;
  }
switchD_001377e0_default:
  return;
}

Assistant:

static void
xml_end(void *userData, const char *name)
{
	struct archive_read *a;
	struct xar *xar;

	a = (struct archive_read *)userData;
	xar = (struct xar *)(a->format->data);

#if DEBUG
	fprintf(stderr, "xml_end:[%s]\n", name);
#endif
	switch (xar->xmlsts) {
	case INIT:
		break;
	case XAR:
		if (strcmp(name, "xar") == 0)
			xar->xmlsts = INIT;
		break;
	case TOC:
		if (strcmp(name, "toc") == 0)
			xar->xmlsts = XAR;
		break;
	case TOC_CREATION_TIME:
		if (strcmp(name, "creation-time") == 0)
			xar->xmlsts = TOC;
		break;
	case TOC_CHECKSUM:
		if (strcmp(name, "checksum") == 0)
			xar->xmlsts = TOC;
		break;
	case TOC_CHECKSUM_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = TOC_CHECKSUM;
		break;
	case TOC_CHECKSUM_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = TOC_CHECKSUM;
		break;
	case TOC_FILE:
		if (strcmp(name, "file") == 0) {
			if (xar->file->parent != NULL &&
			    ((xar->file->mode & AE_IFMT) == AE_IFDIR))
				xar->file->parent->subdirs++;
			xar->file = xar->file->parent;
			if (xar->file == NULL)
				xar->xmlsts = TOC;
		}
		break;
	case FILE_DATA:
		if (strcmp(name, "data") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DATA_LENGTH:
		if (strcmp(name, "length") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_ENCODING:
		if (strcmp(name, "encoding") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_A_CHECKSUM:
		if (strcmp(name, "archived-checksum") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_E_CHECKSUM:
		if (strcmp(name, "extracted-checksum") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_CONTENT:
		if (strcmp(name, "content") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_EA:
		if (strcmp(name, "ea") == 0) {
			xar->xmlsts = TOC_FILE;
			xar->xattr = NULL;
		}
		break;
	case FILE_EA_LENGTH:
		if (strcmp(name, "length") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_ENCODING:
		if (strcmp(name, "encoding") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_A_CHECKSUM:
		if (strcmp(name, "archived-checksum") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_E_CHECKSUM:
		if (strcmp(name, "extracted-checksum") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_NAME:
		if (strcmp(name, "name") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_FSTYPE:
		if (strcmp(name, "fstype") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_CTIME:
		if (strcmp(name, "ctime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_MTIME:
		if (strcmp(name, "mtime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ATIME:
		if (strcmp(name, "atime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_GROUP:
		if (strcmp(name, "group") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_GID:
		if (strcmp(name, "gid") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_USER:
		if (strcmp(name, "user") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_UID:
		if (strcmp(name, "uid") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_MODE:
		if (strcmp(name, "mode") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DEVICE:
		if (strcmp(name, "device") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DEVICE_MAJOR:
		if (strcmp(name, "major") == 0)
			xar->xmlsts = FILE_DEVICE;
		break;
	case FILE_DEVICE_MINOR:
		if (strcmp(name, "minor") == 0)
			xar->xmlsts = FILE_DEVICE;
		break;
	case FILE_DEVICENO:
		if (strcmp(name, "deviceno") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_INODE:
		if (strcmp(name, "inode") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_LINK:
		if (strcmp(name, "link") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_TYPE:
		if (strcmp(name, "type") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_NAME:
		if (strcmp(name, "name") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ACL:
		if (strcmp(name, "acl") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ACL_DEFAULT:
		if (strcmp(name, "default") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_ACL_ACCESS:
		if (strcmp(name, "access") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_ACL_APPLEEXTENDED:
		if (strcmp(name, "appleextended") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_FLAGS:
		if (strcmp(name, "flags") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_FLAGS_USER_NODUMP:
		if (strcmp(name, "UserNoDump") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_IMMUTABLE:
		if (strcmp(name, "UserImmutable") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_APPEND:
		if (strcmp(name, "UserAppend") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_OPAQUE:
		if (strcmp(name, "UserOpaque") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_NOUNLINK:
		if (strcmp(name, "UserNoUnlink") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_ARCHIVED:
		if (strcmp(name, "SystemArchived") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_IMMUTABLE:
		if (strcmp(name, "SystemImmutable") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_APPEND:
		if (strcmp(name, "SystemAppend") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_NOUNLINK:
		if (strcmp(name, "SystemNoUnlink") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_SNAPSHOT:
		if (strcmp(name, "SystemSnapshot") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_EXT2:
		if (strcmp(name, "ext2") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_EXT2_SecureDeletion:
		if (strcmp(name, "SecureDeletion") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Undelete:
		if (strcmp(name, "Undelete") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Compress:
		if (strcmp(name, "Compress") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Synchronous:
		if (strcmp(name, "Synchronous") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Immutable:
		if (strcmp(name, "Immutable") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_AppendOnly:
		if (strcmp(name, "AppendOnly") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoDump:
		if (strcmp(name, "NoDump") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoAtime:
		if (strcmp(name, "NoAtime") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompDirty:
		if (strcmp(name, "CompDirty") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompBlock:
		if (strcmp(name, "CompBlock") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoCompBlock:
		if (strcmp(name, "NoCompBlock") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompError:
		if (strcmp(name, "CompError") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_BTree:
		if (strcmp(name, "BTree") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_HashIndexed:
		if (strcmp(name, "HashIndexed") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_iMagic:
		if (strcmp(name, "iMagic") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Journaled:
		if (strcmp(name, "Journaled") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoTail:
		if (strcmp(name, "NoTail") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_DirSync:
		if (strcmp(name, "DirSync") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_TopDir:
		if (strcmp(name, "TopDir") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Reserved:
		if (strcmp(name, "Reserved") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case UNKNOWN:
		unknowntag_end(xar, name);
		break;
	}
}